

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O0

void __thiscall
BVFixed::SetRange<Js::LoopFlags>(BVFixed *this,LoopFlags *value,BVIndex start,BVIndex len)

{
  BVUnitTContainer *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  byte bVar5;
  ulong uVar6;
  ulong local_158;
  ulong local_120;
  long local_f8;
  BVUnitT<unsigned_long> local_e8;
  BVUnitT<unsigned_long> local_e0;
  ulong local_d8;
  BVUnitTContainer mask_3;
  BVUnitT<unsigned_long> local_c8;
  uint local_bc;
  BVUnitT<unsigned_long> BStack_b8;
  uint i_1;
  BVUnitT<unsigned_long> local_b0;
  ulong local_a8;
  BVUnitTContainer mask_2;
  BVUnitT<unsigned_long> local_98;
  ulong local_90;
  BVUnitTContainer mask_1;
  BVUnitT<unsigned_long> local_80;
  uint local_74;
  BVUnitT<unsigned_long> BStack_70;
  uint i;
  BVUnitT<unsigned_long> local_68;
  ulong local_60;
  BVUnitTContainer mask;
  BVUnitTContainer bitsToSet;
  LoopFlags *pLStack_48;
  int oStartComplement;
  BVUnitTContainer *bits;
  BVUnitTContainer temp;
  BVIndex BStack_30;
  BVIndex oEnd;
  BVIndex oStart;
  BVIndex iEnd;
  BVIndex iStart;
  BVIndex end;
  BVIndex len_local;
  BVIndex start_local;
  LoopFlags *value_local;
  BVFixed *this_local;
  
  iStart = len;
  end = start;
  _len_local = value;
  value_local = (LoopFlags *)this;
  AssertRange(this,start);
  if (iStart != 0) {
    if (8 < iStart) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                         ,0xf2,"(len <= sizeof(Container) * MachBits)",
                         "len <= sizeof(Container) * MachBits");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    iEnd = (end + iStart) - 1;
    AssertRange(this,iEnd);
    oStart = BVUnitT<unsigned_long>::Position(end);
    oEnd = BVUnitT<unsigned_long>::Position(iEnd);
    BStack_30 = BVUnitT<unsigned_long>::Offset(end);
    temp._4_4_ = BVUnitT<unsigned_long>::Offset(iEnd);
    bits = (BVUnitTContainer *)(ulong)(byte)*_len_local;
    pLStack_48 = (LoopFlags *)&bits;
    bitsToSet._4_4_ = 0x40 - BStack_30;
    bVar5 = (byte)BStack_30;
    if (oEnd == oStart) {
      if (temp._4_4_ == 0x3f) {
        local_f8 = -1;
      }
      else {
        local_f8 = (1L << (((char)temp._4_4_ + '\x01') - bVar5 & 0x3f)) + -1;
      }
      local_60 = local_f8 << (bVar5 & 0x3f);
      mask = (long)bits << (bVar5 & 0x3f);
      uVar6 = (ulong)oStart;
      BVUnitT<unsigned_long>::BVUnitT(&local_68,mask & local_60);
      BVUnitT<unsigned_long>::Or((BVUnitT<unsigned_long> *)(this + uVar6 + 1),local_68);
      uVar6 = (ulong)oStart;
      BVUnitT<unsigned_long>::BVUnitT(&stack0xffffffffffffff90,mask | local_60 ^ 0xffffffffffffffff)
      ;
      BVUnitT<unsigned_long>::And((BVUnitT<unsigned_long> *)(this + uVar6 + 1),BStack_70);
    }
    else if (BStack_30 == 0) {
      for (local_74 = oStart; local_74 < oEnd; local_74 = local_74 + 1) {
        uVar6 = (ulong)local_74;
        BVUnitT<unsigned_long>::BVUnitT(&local_80,(unsigned_long)*(BVUnitTContainer **)pLStack_48);
        BVUnitT<unsigned_long>::Or((BVUnitT<unsigned_long> *)(this + uVar6 + 1),local_80);
        uVar6 = (ulong)local_74;
        BVUnitT<unsigned_long>::BVUnitT
                  ((BVUnitT<unsigned_long> *)&mask_1,(unsigned_long)*(BVUnitTContainer **)pLStack_48
                  );
        BVUnitT<unsigned_long>::And
                  ((BVUnitT<unsigned_long> *)(this + uVar6 + 1),(BVUnitT<unsigned_long>)mask_1);
        pLStack_48 = pLStack_48 + 8;
      }
      if (temp._4_4_ == 0x3f) {
        local_120 = 0xffffffffffffffff;
      }
      else {
        local_120 = (1L << ((char)temp._4_4_ + 1U & 0x3f)) - 1;
      }
      local_90 = local_120;
      uVar6 = (ulong)oEnd;
      BVUnitT<unsigned_long>::BVUnitT(&local_98,(ulong)*(BVUnitTContainer **)pLStack_48 & local_120)
      ;
      BVUnitT<unsigned_long>::Or((BVUnitT<unsigned_long> *)(this + uVar6 + 1),local_98);
      uVar6 = (ulong)oEnd;
      BVUnitT<unsigned_long>::BVUnitT
                ((BVUnitT<unsigned_long> *)&mask_2,
                 (ulong)*(BVUnitTContainer **)pLStack_48 | local_90 ^ 0xffffffffffffffff);
      BVUnitT<unsigned_long>::And
                ((BVUnitT<unsigned_long> *)(this + uVar6 + 1),(BVUnitT<unsigned_long>)mask_2);
    }
    else {
      local_a8 = -1L << (bVar5 & 0x3f);
      uVar6 = (ulong)oStart;
      BVUnitT<unsigned_long>::BVUnitT(&local_b0,(long)bits << (bVar5 & 0x3f) & local_a8);
      BVUnitT<unsigned_long>::Or((BVUnitT<unsigned_long> *)(this + uVar6 + 1),local_b0);
      uVar6 = (ulong)oStart;
      BVUnitT<unsigned_long>::BVUnitT
                (&stack0xffffffffffffff48,
                 (long)*(BVUnitTContainer **)pLStack_48 << ((byte)BStack_30 & 0x3f) |
                 local_a8 ^ 0xffffffffffffffff);
      BVUnitT<unsigned_long>::And((BVUnitT<unsigned_long> *)(this + uVar6 + 1),BStack_b8);
      local_bc = oStart;
      while( true ) {
        local_bc = local_bc + 1;
        if (oEnd <= local_bc) break;
        pBVar1 = *(BVUnitTContainer **)pLStack_48;
        pLStack_48 = pLStack_48 + 8;
        mask = (long)*(BVUnitTContainer **)pLStack_48 << ((byte)BStack_30 & 0x3f) |
               (ulong)pBVar1 >> ((byte)bitsToSet._4_4_ & 0x3f);
        uVar6 = (ulong)local_bc;
        BVUnitT<unsigned_long>::BVUnitT(&local_c8,mask);
        BVUnitT<unsigned_long>::Or((BVUnitT<unsigned_long> *)(this + uVar6 + 1),local_c8);
        uVar6 = (ulong)local_bc;
        BVUnitT<unsigned_long>::BVUnitT((BVUnitT<unsigned_long> *)&mask_3,mask);
        BVUnitT<unsigned_long>::And
                  ((BVUnitT<unsigned_long> *)(this + uVar6 + 1),(BVUnitT<unsigned_long>)mask_3);
      }
      pBVar1 = *(BVUnitTContainer **)pLStack_48;
      pLStack_48 = pLStack_48 + 8;
      mask = (long)*(BVUnitTContainer **)pLStack_48 << ((byte)BStack_30 & 0x3f) |
             (ulong)pBVar1 >> ((byte)bitsToSet._4_4_ & 0x3f);
      if (temp._4_4_ == 0x3f) {
        local_158 = 0xffffffffffffffff;
      }
      else {
        local_158 = (1L << ((char)temp._4_4_ + 1U & 0x3f)) - 1;
      }
      local_d8 = local_158;
      uVar6 = (ulong)oEnd;
      BVUnitT<unsigned_long>::BVUnitT(&local_e0,mask & local_158);
      BVUnitT<unsigned_long>::Or((BVUnitT<unsigned_long> *)(this + uVar6 + 1),local_e0);
      uVar6 = (ulong)oEnd;
      BVUnitT<unsigned_long>::BVUnitT(&local_e8,mask | local_d8 ^ 0xffffffffffffffff);
      BVUnitT<unsigned_long>::And((BVUnitT<unsigned_long> *)(this + uVar6 + 1),local_e8);
    }
    *_len_local = *pLStack_48;
  }
  return;
}

Assistant:

void BVFixed::SetRange(Container* value, BVIndex start, BVIndex len)
{
    AssertRange(start);
    if (len == 0)
    {
        return;
    }
    Assert(len <= sizeof(Container) * MachBits);
    BVIndex end = start + len - 1;
    AssertRange(end);
    BVIndex iStart = BVUnit::Position(start);
    BVIndex iEnd = BVUnit::Position(end);
    BVIndex oStart = BVUnit::Offset(start);
    BVIndex oEnd = BVUnit::Offset(end);

    BVUnit::BVUnitTContainer temp;
    BVUnit::BVUnitTContainer* bits;
    static_assert(sizeof(Container) == 1 || sizeof(Container) == sizeof(BVUnit::BVUnitTContainer),
        "Container is not suitable to represent the calculated value");
    if (sizeof(Container) == 1)
    {
        static_assert(sizeof(byte) == 1, "Size of byte should be 1.");
        temp = *(byte*)value;
        bits = &temp;
    }
    else
    {
        bits = (BVUnit::BVUnitTContainer*)value;
    }
    const int oStartComplement = BVUnit::BitsPerWord - oStart;
    static_assert((BVUnit::BVUnitTContainer)BVUnit::AllOnesMask > 0, "Container type of BVFixed must be unsigned");
    //When making the mask, check the special case when we need all bits
#define MAKE_MASK(start, end) ( ((end) == BVUnit::BitsPerWord ? BVUnit::AllOnesMask : (((BVUnit::BVUnitTContainer)1 << ((end) - (start))) - 1))   << (start))
    // Or the value to set the bits to 1. And the value to set the bits to 0
    // The mask is used to make sure we don't modify the bits outside the range
#define SET_RANGE(i, value, mask) \
    this->data[i].Or((value) & mask);\
    this->data[i].And((value) | ~mask);

    BVUnit::BVUnitTContainer bitsToSet;
    // Fast Path
    if (iEnd == iStart)
    {
        const BVUnit::BVUnitTContainer mask = MAKE_MASK(oStart, oEnd + 1);
        // Shift to position the bits
        bitsToSet = (*bits << oStart);
        SET_RANGE(iStart, bitsToSet, mask);
    }
    // TODO: case iEnd == iStart + 1 to avoid a loop
    else if (oStart == 0)
    {
        // Simpler case where we don't have to shift the bits around
        for (uint i = iStart; i < iEnd; ++i)
        {
            SET_RANGE(i, *bits, BVUnit::AllOnesMask);
            ++bits;
        }
        // We still need to use a mask to remove the unused bits
        const BVUnit::BVUnitTContainer mask = MAKE_MASK(0, oEnd + 1);
        SET_RANGE(iEnd, *bits, mask);
    }
    else
    {
        // Default case. We need to process everything 1 at a time
        {
            // First set the first bits
CLANG_WNO_BEGIN("-Wtautological-compare")
            const BVUnit::BVUnitTContainer mask = MAKE_MASK(oStart, BVUnit::BitsPerWord);
CLANG_WNO_END
            SET_RANGE(iStart, *bits << oStart, mask);
        }
        // Set the bits in the middle
        for (uint i = iStart + 1; i < iEnd; ++i)
        {
            bitsToSet = *bits >> oStartComplement;
            ++bits;
            bitsToSet |= *bits << oStart;
            SET_RANGE(i, bitsToSet, BVUnit::AllOnesMask);
        }
        // Set the last bits
        bitsToSet = *bits >> oStartComplement;
        ++bits;
        bitsToSet |= *bits << oStart;
        {
            const BVUnit::BVUnitTContainer mask = MAKE_MASK(0, oEnd + 1);
            SET_RANGE(iEnd, bitsToSet, mask);
        }
    }

    if (sizeof(Container) == 1)
    {
        // Calculation above might overflow the original container.
        // normalize the overflow value. LE only
        temp = (*((char*)bits)) + (*(((char*)bits) + 1));
        memcpy(value, bits, 1);
    }
#undef MAKE_MASK
#undef SET_RANGE
}